

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate1.hpp
# Opt level: O2

void __thiscall
qclab::qgates::QRotationGate1<double>::QRotationGate1
          (QRotationGate1<double> *this,int qubit,rotation_type *rot,bool fixed)

{
  double dVar1;
  
  QGate1<double>::QGate1(&this->super_QGate1<double>,qubit);
  (this->super_QGate1<double>).field_0xc = fixed;
  (this->super_QGate1<double>).super_QObject<double>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00132260;
  dVar1 = (rot->angle_).sin_;
  (this->rotation_).angle_.cos_ = (rot->angle_).cos_;
  (this->rotation_).angle_.sin_ = dVar1;
  return;
}

Assistant:

QRotationGate1( const int qubit , const rotation_type& rot ,
                        const bool fixed = false )
        : QGate1< T >( qubit )
        , rotation_( rot )
        , QAdjustable( fixed )
        { }